

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O0

void __thiscall
bandit::reporter::progress_base::progress_base(progress_base *this,failure_formatter_t *formatter)

{
  failure_formatter_t *formatter_local;
  progress_base *this_local;
  
  interface::interface(&this->super_interface);
  (this->super_interface)._vptr_interface = (_func_int **)&PTR__progress_base_00142378;
  this->specs_run_ = 0;
  this->specs_succeeded_ = 0;
  this->specs_failed_ = 0;
  this->specs_skipped_ = 0;
  this->failure_formatter_ = formatter;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->contexts_);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->failures_);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->test_run_errors_);
  return;
}

Assistant:

progress_base(const detail::failure_formatter_t& formatter)
          : specs_run_(0), specs_succeeded_(0), specs_failed_(0), specs_skipped_(0),
            failure_formatter_(formatter) {}